

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

double __thiscall biosoup::Timer::Stop(Timer *this)

{
  rep rVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<double,_std::ratio<1L,_1L>_> local_30;
  Timer *local_28;
  rep_conflict duration;
  Timer *local_18;
  Timer *this_local;
  
  local_18 = this;
  duration = (rep_conflict)
             std::chrono::
             time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             ::time_since_epoch(&this->checkpoint_);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&duration);
  if (rVar1 == 0) {
    this_local = (Timer *)0x0;
  }
  else {
    local_40.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_38.__r = (rep)std::chrono::operator-(&local_40,&this->checkpoint_);
    local_30.__r = (rep_conflict)
                   std::chrono::
                   duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                             (&local_38);
    local_28 = (Timer *)std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_30);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(&local_48);
    (this->checkpoint_).__d.__r = (rep)local_48.__d.__r;
    this->elapsed_time_ = (double)local_28 + this->elapsed_time_;
    this_local = local_28;
  }
  return (double)this_local;
}

Assistant:

double Stop() {
    if (checkpoint_.time_since_epoch().count()) {  // Start() was called
      auto duration = std::chrono::duration_cast<std::chrono::duration<double>>(
          std::chrono::steady_clock::now() - checkpoint_).count();
      checkpoint_ = {};
      elapsed_time_ += duration;
      return duration;
    }
    return 0;
  }